

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O3

void __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::Destroy(OwningStringMap<unsigned_long,_std::unordered_map<duckdb::string_t,_unsigned_long,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
          *this)

{
  _Hash_node_base *p_Var1;
  
  p_Var1 = (this->map)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0 && this->free_type == REQUIRES_FREE) {
    do {
      if ((this->free_type == REQUIRES_FREE) && (0xc < (ulong)*(uint *)&p_Var1[1]._M_nxt)) {
        Allocator::FreeData(this->allocator,(data_ptr_t)p_Var1[2]._M_nxt,
                            (ulong)*(uint *)&p_Var1[1]._M_nxt);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  ::std::
  _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_long>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->map)._M_h);
  return;
}

Assistant:

void Destroy() {
		if (free_type == AllocatorFreeType::REQUIRES_FREE) {
			for (auto &str : map) {
				DestroyString(str.first);
			}
		}
		map.clear();
	}